

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void wallet::ErrorLogCallback(void *arg,int code,char *msg)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  char **in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  char *local_d8;
  int local_d0 [26];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = msg;
  local_d0[0] = code;
  if (arg != (void *)0x0) {
    __assert_fail("arg == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x2a,"void wallet::ErrorLogCallback(void *, int, const char *)");
  }
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  if (bVar1) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    tinyformat::format<int,char_const*>
              (&local_68,(tinyformat *)"SQLite Error. Code: %d. Message: %s\n",(char *)local_d0,
               (int *)&local_d8,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pLVar2 = LogInstance();
    local_68._M_dataplus._M_p = (pointer)0x5a;
    local_68._M_string_length = 0x4a74cc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    str._M_str = local_48._M_dataplus._M_p;
    str._M_len = local_48._M_string_length;
    logging_function._M_str = "ErrorLogCallback";
    logging_function._M_len = 0x10;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x2b,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ErrorLogCallback(void* arg, int code, const char* msg)
{
    // From sqlite3_config() documentation for the SQLITE_CONFIG_LOG option:
    // "The void pointer that is the second argument to SQLITE_CONFIG_LOG is passed through as
    // the first parameter to the application-defined logger function whenever that function is
    // invoked."
    // Assert that this is the case:
    assert(arg == nullptr);
    LogPrintf("SQLite Error. Code: %d. Message: %s\n", code, msg);
}